

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void __thiscall
wasm::WasmBinaryBuilder::visitRefAsCast(WasmBinaryBuilder *this,RefCast *curr,uint32_t code)

{
  uintptr_t in_RAX;
  Expression *pEVar1;
  HeapType heapType;
  Type local_28;
  
  if (code == 0x5a) {
    heapType.id = 4;
  }
  else {
    if (code != 0x58) {
      handle_unreachable("unexpected ref.as*",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-binary.cpp"
                         ,0x1b34);
    }
    heapType.id = 1;
  }
  local_28.id = in_RAX;
  wasm::Type::Type(&local_28,heapType,NonNullable);
  (curr->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.type.id = local_28.id;
  pEVar1 = popNonVoidExpression(this);
  curr->ref = pEVar1;
  curr->safety = Safe;
  RefCast::finalize(curr);
  return;
}

Assistant:

void WasmBinaryBuilder::visitRefAsCast(RefCast* curr, uint32_t code) {
  // TODO: These instructions are deprecated. Remove them.
  switch (code) {
    case BinaryConsts::RefAsFunc:
      curr->type = Type(HeapType::func, NonNullable);
      break;
    case BinaryConsts::RefAsI31:
      curr->type = Type(HeapType::i31, NonNullable);
      break;
    default:
      WASM_UNREACHABLE("unexpected ref.as*");
  }
  curr->ref = popNonVoidExpression();
  curr->safety = RefCast::Safe;
  curr->finalize();
}